

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarization.cpp
# Opt level: O2

binarization * __thiscall
pobr::imgProcessing::utils::binarization::invertBinaryImage(binarization *this,Mat *img)

{
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  cv::Mat::clone();
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/binarization.cpp:120:9)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/binarization.cpp:120:9)>
             ::_M_manager;
  local_30._M_unused._0_8_ = (undefined8)this;
  matrixOps::forEachPixel
            (img,(function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)&local_30);
  std::_Function_base::~_Function_base((_Function_base *)&local_30);
  return this;
}

Assistant:

cv::Mat
binarization::invertBinaryImage(const cv::Mat& img)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = resultImg.at<cv::Vec3b>(y, x);
            uint8_t value = 255 - thisPixel[0];

            thisPixel[0] = value;
            thisPixel[1] = value;
            thisPixel[2] = value;
        }
    );

    return resultImg;
}